

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O3

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveLleft(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *vec)

{
  uint *puVar1;
  int *piVar2;
  int iVar3;
  cpp_dec_float<50U,_int,_void> *pcVar4;
  long lVar5;
  cpp_dec_float<50U,_int,_void> *v;
  long lVar6;
  long lVar7;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_b8;
  cpp_dec_float<50U,_int,_void> local_78;
  long local_38;
  
  lVar5 = (long)this->thedim;
  if (0 < lVar5) {
    do {
      lVar6 = (long)(this->l).rorig[lVar5 + -1];
      local_78.data._M_elems._32_8_ = *(undefined8 *)(vec[lVar6].m_backend.data._M_elems + 8);
      local_78.data._M_elems._0_8_ = *(undefined8 *)vec[lVar6].m_backend.data._M_elems;
      local_78.data._M_elems._8_8_ = *(undefined8 *)(vec[lVar6].m_backend.data._M_elems + 2);
      puVar1 = vec[lVar6].m_backend.data._M_elems + 4;
      local_78.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      local_78.data._M_elems._24_8_ = *(undefined8 *)(puVar1 + 2);
      local_78.exp = vec[lVar6].m_backend.exp;
      local_78.neg = vec[lVar6].m_backend.neg;
      local_78.fpclass = vec[lVar6].m_backend.fpclass;
      local_78.prec_elem = vec[lVar6].m_backend.prec_elem;
      local_38 = lVar5;
      if (local_78.fpclass == cpp_dec_float_NaN) {
LAB_0028ed86:
        piVar2 = (this->l).rbeg;
        iVar3 = piVar2[lVar6];
        lVar5 = (long)iVar3;
        if (iVar3 < piVar2[lVar6 + 1]) {
          lVar7 = lVar5 * 0x38;
          do {
            iVar3 = (this->l).ridx[lVar5];
            pcVar4 = (cpp_dec_float<50U,_int,_void> *)
                     ((long)(((this->l).rval.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                     lVar7);
            local_b8.fpclass = cpp_dec_float_finite;
            local_b8.prec_elem = 10;
            local_b8.data._M_elems[0] = 0;
            local_b8.data._M_elems[1] = 0;
            local_b8.data._M_elems[2] = 0;
            local_b8.data._M_elems[3] = 0;
            local_b8.data._M_elems[4] = 0;
            local_b8.data._M_elems[5] = 0;
            local_b8.data._M_elems._24_5_ = 0;
            local_b8.data._M_elems[7]._1_3_ = 0;
            local_b8.data._M_elems._32_5_ = 0;
            local_b8.data._M_elems[9]._1_3_ = 0;
            local_b8.exp = 0;
            local_b8.neg = false;
            v = &local_78;
            if (pcVar4 != &local_b8) {
              local_b8.data._M_elems._32_5_ = local_78.data._M_elems._32_5_;
              local_b8.data._M_elems[9]._1_3_ = local_78.data._M_elems[9]._1_3_;
              local_b8.data._M_elems[4] = local_78.data._M_elems[4];
              local_b8.data._M_elems[5] = local_78.data._M_elems[5];
              local_b8.data._M_elems._24_5_ = local_78.data._M_elems._24_5_;
              local_b8.data._M_elems[7]._1_3_ = local_78.data._M_elems[7]._1_3_;
              local_b8.data._M_elems[0] = local_78.data._M_elems[0];
              local_b8.data._M_elems[1] = local_78.data._M_elems[1];
              local_b8.data._M_elems[2] = local_78.data._M_elems[2];
              local_b8.data._M_elems[3] = local_78.data._M_elems[3];
              local_b8.exp = local_78.exp;
              local_b8.neg = local_78.neg;
              local_b8.fpclass = local_78.fpclass;
              local_b8.prec_elem = local_78.prec_elem;
              v = pcVar4;
            }
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(&local_b8,v);
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                      (&vec[iVar3].m_backend,&local_b8);
            lVar5 = lVar5 + 1;
            lVar7 = lVar7 + 0x38;
          } while (lVar5 < (this->l).rbeg[lVar6 + 1]);
        }
      }
      else {
        local_b8.fpclass = cpp_dec_float_finite;
        local_b8.prec_elem = 10;
        local_b8.data._M_elems[0] = 0;
        local_b8.data._M_elems[1] = 0;
        local_b8.data._M_elems[2] = 0;
        local_b8.data._M_elems[3] = 0;
        local_b8.data._M_elems[4] = 0;
        local_b8.data._M_elems[5] = 0;
        local_b8.data._M_elems._24_5_ = 0;
        local_b8.data._M_elems[7]._1_3_ = 0;
        local_b8.data._M_elems._32_5_ = 0;
        local_b8.data._M_elems[9]._1_3_ = 0;
        local_b8.exp = 0;
        local_b8.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_b8,0.0);
        iVar3 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                          (&local_78,&local_b8);
        if (iVar3 != 0) goto LAB_0028ed86;
      }
      lVar5 = local_38 + -1;
    } while (1 < local_38);
  }
  return;
}

Assistant:

void CLUFactor<R>::solveLleft(R* vec) const
{

#ifndef SOPLEX_WITH_L_ROWS
   int*  idx;
   R* val;
   R* lval  = l.val.data();
   int*  lidx  = l.idx;
   int*  lrow  = l.row;
   int*  lbeg  = l.start;

   for(int i = l.firstUpdate - 1; i >= 0; --i)
   {
      int k = lbeg[i];
      val = &lval[k];
      idx = &lidx[k];
      x = 0;

      for(int j = lbeg[i + 1]; j > k; --j)
         x += vec[*idx++] * (*val++);

      vec[lrow[i]] -= x;
   }

#else

   for(int i = thedim - 1; i >= 0; --i)
   {
      int  r = l.rorig[i];
      R x = vec[r];

      if(x != 0.0)
      {
         for(int k = l.rbeg[r]; k < l.rbeg[r + 1]; k++)
         {
            int j = l.ridx[k];

            assert(l.rperm[j] < i);

            vec[j] -= x * l.rval[k];
         }
      }
   }

#endif // SOPLEX_WITH_L_ROWS
}